

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astring.c
# Opt level: O2

void AString_remove(AString *str,size_t index,size_t count)

{
  ulong uVar1;
  
  if ((str != (AString *)0x0) && (uVar1 = str->size, index < uVar1)) {
    if (count < ~index && count + index < uVar1) {
      str->size = uVar1 - count;
      memmove(str->buffer + index,str->buffer + index + count,((uVar1 - count) - index) + 1);
      return;
    }
    str->size = index;
    str->buffer[index] = '\0';
  }
  return;
}

Assistant:

ACUTILS_HD_FUNC void AString_remove(struct AString *str, size_t index, size_t count)
{
    if(str != nullptr && index < str->size) {
        if(count >= ((size_t) 0) - index - 1 || index + count >= str->size) {
            str->size = index;
            str->buffer[str->size] = '\0';
        } else {
            str->size -= count;
            memmove(str->buffer + index, str->buffer + index + count, (str->size - index + 1) * sizeof(char)); /* +1 for '\0' */
        }
    }
}